

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::CompletionItem>::destruct
          (BasicTypeInfo<dap::CompletionItem> *this,void *ptr)

{
  if (*(long **)((long)ptr + 0xd8) != (long *)((long)ptr + 0xe8)) {
    operator_delete(*(long **)((long)ptr + 0xd8),*(long *)((long)ptr + 0xe8) + 1);
  }
  if (*(long **)((long)ptr + 0xb0) != (long *)((long)ptr + 0xc0)) {
    operator_delete(*(long **)((long)ptr + 0xb0),*(long *)((long)ptr + 0xc0) + 1);
  }
  if (*(long **)((long)ptr + 0x78) != (long *)((long)ptr + 0x88)) {
    operator_delete(*(long **)((long)ptr + 0x78),*(long *)((long)ptr + 0x88) + 1);
  }
  if (*(long **)((long)ptr + 0x28) != (long *)((long)ptr + 0x38)) {
    operator_delete(*(long **)((long)ptr + 0x28),*(long *)((long)ptr + 0x38) + 1);
  }
  if (*ptr != (long *)((long)ptr + 0x10)) {
    operator_delete(*ptr,*(long *)((long)ptr + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }